

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct16x16_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int32_t iVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int32_t *piVar5;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  uint in_R9D;
  undefined1 auVar6 [16];
  __m128i offset;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  __m128i cospi32;
  int32_t *cospi;
  char local_280;
  char local_27c;
  int iStack_25c;
  int iStack_24c;
  byte local_210;
  char local_204;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  piVar5 = cospi_arr(in_EDX);
  iVar1 = piVar5[0x20];
  auVar6._4_4_ = iVar1;
  auVar6._0_4_ = iVar1;
  auVar6._12_4_ = iVar1;
  auVar6._8_4_ = iVar1;
  local_204 = (char)in_EDX;
  iVar3 = 1 << (local_204 - 1U & 0x1f);
  iVar4 = 8;
  if (in_ECX != 0) {
    iVar4 = 6;
  }
  if (in_R8D + iVar4 < 0x10) {
    local_27c = '\x10';
  }
  else {
    local_27c = '\b';
    if (in_ECX != 0) {
      local_27c = '\x06';
    }
    local_27c = (char)in_R8D + local_27c;
  }
  auVar6 = pmulld(*in_RDI,auVar6);
  *in_RDI = auVar6;
  local_1a8 = (int)*(undefined8 *)*in_RDI;
  iStack_1a4 = (int)((ulong)*(undefined8 *)*in_RDI >> 0x20);
  iStack_1a0 = (int)*(undefined8 *)(*in_RDI + 8);
  iStack_19c = (int)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
  *(int *)*in_RDI = local_1a8 + iVar3;
  *(int *)(*in_RDI + 4) = iStack_1a4 + iVar3;
  *(int *)(*in_RDI + 8) = iStack_1a0 + iVar3;
  *(int *)(*in_RDI + 0xc) = iStack_19c + iVar3;
  local_1e8 = (int)*(undefined8 *)*in_RDI;
  iStack_1e4 = (int)((ulong)*(undefined8 *)*in_RDI >> 0x20);
  iStack_1e0 = (int)*(undefined8 *)(*in_RDI + 8);
  iStack_1dc = (int)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
  auVar6 = ZEXT416(in_EDX);
  *(int *)*in_RDI = local_1e8 >> auVar6;
  *(int *)(*in_RDI + 4) = iStack_1e4 >> auVar6;
  *(int *)(*in_RDI + 8) = iStack_1e0 >> auVar6;
  *(int *)(*in_RDI + 0xc) = iStack_1dc >> auVar6;
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_280 = '\x10';
    }
    else {
      local_280 = (char)in_R8D + '\x06';
    }
    local_27c = local_280;
    if (in_R9D != 0) {
      local_210 = (byte)in_R9D;
      iVar3 = (1 << (local_210 & 0x1f)) >> 1;
      local_1c8 = (int)*(undefined8 *)*in_RDI;
      iStack_1c4 = (int)((ulong)*(undefined8 *)*in_RDI >> 0x20);
      iStack_1c0 = (int)*(undefined8 *)(*in_RDI + 8);
      iStack_1bc = (int)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
      *(int *)*in_RDI = local_1c8 + iVar3;
      *(int *)(*in_RDI + 4) = iStack_1c4 + iVar3;
      *(int *)(*in_RDI + 8) = iStack_1c0 + iVar3;
      *(int *)(*in_RDI + 0xc) = iStack_1bc + iVar3;
      local_28 = (int)*(undefined8 *)*in_RDI;
      iStack_24 = (int)((ulong)*(undefined8 *)*in_RDI >> 0x20);
      iStack_20 = (int)*(undefined8 *)(*in_RDI + 8);
      iStack_1c = (int)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
      auVar6 = ZEXT416(in_R9D);
      *(int *)*in_RDI = local_28 >> auVar6;
      *(int *)(*in_RDI + 4) = iStack_24 >> auVar6;
      *(int *)(*in_RDI + 8) = iStack_20 >> auVar6;
      *(int *)(*in_RDI + 0xc) = iStack_1c >> auVar6;
    }
  }
  iStack_25c = (1 << (local_27c - 1U & 0x1f)) + -1;
  iStack_24c = -(1 << (local_27c - 1U & 0x1f));
  local_68 = (int)*(undefined8 *)*in_RDI;
  iStack_64 = (int)((ulong)*(undefined8 *)*in_RDI >> 0x20);
  iStack_60 = (int)*(undefined8 *)(*in_RDI + 8);
  iStack_5c = (int)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
  *(uint *)*in_RDI =
       (uint)(local_68 < iStack_24c) * iStack_24c | (uint)(local_68 >= iStack_24c) * local_68;
  *(uint *)(*in_RDI + 4) =
       (uint)(iStack_64 < iStack_24c) * iStack_24c | (uint)(iStack_64 >= iStack_24c) * iStack_64;
  *(uint *)(*in_RDI + 8) =
       (uint)(iStack_60 < iStack_24c) * iStack_24c | (uint)(iStack_60 >= iStack_24c) * iStack_60;
  *(uint *)(*in_RDI + 0xc) =
       (uint)(iStack_5c < iStack_24c) * iStack_24c | (uint)(iStack_5c >= iStack_24c) * iStack_5c;
  local_48 = (int)*(undefined8 *)*in_RDI;
  iStack_44 = (int)((ulong)*(undefined8 *)*in_RDI >> 0x20);
  iStack_40 = (int)*(undefined8 *)(*in_RDI + 8);
  iStack_3c = (int)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
  *(uint *)*in_RDI =
       (uint)(iStack_25c < local_48) * iStack_25c | (uint)(iStack_25c >= local_48) * local_48;
  *(uint *)(*in_RDI + 4) =
       (uint)(iStack_25c < iStack_44) * iStack_25c | (uint)(iStack_25c >= iStack_44) * iStack_44;
  *(uint *)(*in_RDI + 8) =
       (uint)(iStack_25c < iStack_40) * iStack_25c | (uint)(iStack_25c >= iStack_40) * iStack_40;
  *(uint *)(*in_RDI + 0xc) =
       (uint)(iStack_25c < iStack_3c) * iStack_25c | (uint)(iStack_25c >= iStack_3c) * iStack_3c;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  *in_RSI = *(undefined8 *)*in_RDI;
  in_RSI[1] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[2] = *(undefined8 *)*in_RDI;
  in_RSI[3] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[4] = *(undefined8 *)*in_RDI;
  in_RSI[5] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[6] = *(undefined8 *)*in_RDI;
  in_RSI[7] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[8] = *(undefined8 *)*in_RDI;
  in_RSI[9] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[10] = *(undefined8 *)*in_RDI;
  in_RSI[0xb] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0xc] = *(undefined8 *)*in_RDI;
  in_RSI[0xd] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0xe] = *(undefined8 *)*in_RDI;
  in_RSI[0xf] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x10] = *(undefined8 *)*in_RDI;
  in_RSI[0x11] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x12] = *(undefined8 *)*in_RDI;
  in_RSI[0x13] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x14] = *(undefined8 *)*in_RDI;
  in_RSI[0x15] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x16] = *(undefined8 *)*in_RDI;
  in_RSI[0x17] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x18] = *(undefined8 *)*in_RDI;
  in_RSI[0x19] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x1a] = *(undefined8 *)*in_RDI;
  in_RSI[0x1b] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x1c] = *(undefined8 *)*in_RDI;
  in_RSI[0x1d] = uVar2;
  uVar2 = *(undefined8 *)(*in_RDI + 8);
  in_RSI[0x1e] = *(undefined8 *)*in_RDI;
  in_RSI[0x1f] = uVar2;
  return;
}

Assistant:

static void idct16x16_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  // stage 0
  // stage 1
  // stage 2
  // stage 3
  // stage 4
  in[0] = _mm_mullo_epi32(in[0], cospi32);
  in[0] = _mm_add_epi32(in[0], rnding);
  in[0] = _mm_srai_epi32(in[0], bit);

  // stage 5
  // stage 6
  // stage 7
  if (!do_cols) {
    log_range = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    if (out_shift != 0) {
      __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
      in[0] = _mm_add_epi32(in[0], offset);
      in[0] = _mm_sra_epi32(in[0], _mm_cvtsi32_si128(out_shift));
    }
  }

  in[0] = _mm_max_epi32(in[0], clamp_lo);
  in[0] = _mm_min_epi32(in[0], clamp_hi);
  out[0] = in[0];
  out[1] = in[0];
  out[2] = in[0];
  out[3] = in[0];
  out[4] = in[0];
  out[5] = in[0];
  out[6] = in[0];
  out[7] = in[0];
  out[8] = in[0];
  out[9] = in[0];
  out[10] = in[0];
  out[11] = in[0];
  out[12] = in[0];
  out[13] = in[0];
  out[14] = in[0];
  out[15] = in[0];
}